

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void AddInterfaceEntries(cmGeneratorTarget *thisTarget,string *config,string *prop,
                        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                        *entries)

{
  string *input;
  cmGeneratorTarget *gt;
  cmLinkImplementationLibraries *pcVar1;
  long *plVar2;
  TargetPropertyEntry *pTVar3;
  element_type *peVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pcVar6;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string genex;
  cmGeneratorExpression ge;
  string uniqueName;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_108;
  cmGeneratorExpression local_100;
  undefined1 local_f0 [32];
  TargetPropertyEntry local_d0;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  cmListFileBacktrace local_80;
  undefined8 local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  pointer local_58;
  string local_50;
  
  local_70 = entries;
  local_68 = (element_type *)prop;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)thisTarget;
  pcVar1 = cmGeneratorTarget::GetLinkImplementationLibrariesInternal(thisTarget,config,thisTarget);
  if (pcVar1 != (cmLinkImplementationLibraries *)0x0) {
    pcVar6 = (pcVar1->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (pcVar1->Libraries).
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (pcVar6 != local_58) {
      input = (string *)(local_b0 + 0x10);
      do {
        gt = (pcVar6->super_cmLinkItem).Target;
        if (gt != (cmGeneratorTarget *)0x0) {
          cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                    (&local_50,
                     ((cmLocalGenerator *)local_60._M_pi[1]._vptr__Sp_counted_base)->GlobalGenerator
                     ,gt);
          plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x4fa33c);
          local_f0._16_8_ = &local_d0;
          pTVar3 = (TargetPropertyEntry *)(plVar2 + 2);
          if ((TargetPropertyEntry *)*plVar2 == pTVar3) {
            local_d0._vptr_TargetPropertyEntry = pTVar3->_vptr_TargetPropertyEntry;
            local_d0.LinkImplItem = (cmLinkImplItem *)plVar2[3];
          }
          else {
            local_d0._vptr_TargetPropertyEntry = pTVar3->_vptr_TargetPropertyEntry;
            local_f0._16_8_ = (TargetPropertyEntry *)*plVar2;
          }
          local_f0._24_8_ = plVar2[1];
          *plVar2 = (long)pTVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append(local_f0 + 0x10);
          local_100.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_f0;
          peVar4 = (element_type *)(plVar2 + 2);
          if ((element_type *)*plVar2 == peVar4) {
            local_f0._0_8_ = (peVar4->field_0).Bottom.State;
            local_f0._8_8_ = plVar2[3];
          }
          else {
            local_f0._0_8_ = (peVar4->field_0).Bottom.State;
            local_100.Backtrace.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)*plVar2;
          }
          local_100.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
          *plVar2 = (long)peVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_100,(ulong)(local_68->field_0).Bottom.State);
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 == paVar5) {
            local_90._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_90._8_8_ = plVar2[3];
            local_b0._16_8_ = &local_90;
          }
          else {
            local_90._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_b0._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar2;
          }
          local_b0._24_8_ = plVar2[1];
          *plVar2 = (long)paVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)input);
          local_d0.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_b0;
          peVar4 = (element_type *)(plVar2 + 2);
          if ((element_type *)*plVar2 == peVar4) {
            local_b0._0_8_ = (peVar4->field_0).Bottom.State;
            local_b0._8_8_ = plVar2[3];
          }
          else {
            local_b0._0_8_ = (peVar4->field_0).Bottom.State;
            local_d0.Backtrace.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)*plVar2;
          }
          local_d0.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
          *plVar2 = (long)peVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._16_8_ != &local_90) {
            operator_delete((void *)local_b0._16_8_,local_90._M_allocated_capacity + 1);
          }
          if (local_100.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)local_f0) {
            operator_delete(local_100.Backtrace.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                               *)local_f0._0_8_)->_M_t)._M_impl.field_0x1);
          }
          if ((TargetPropertyEntry *)local_f0._16_8_ != &local_d0) {
            operator_delete((void *)local_f0._16_8_,
                            (ulong)((long)local_d0._vptr_TargetPropertyEntry + 1));
          }
          local_80.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pcVar6->super_cmLinkItem).Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_80.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (pcVar6->super_cmLinkItem).Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_80.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_80.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_80.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_80.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_80.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)input,&local_80);
          if (local_80.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          cmGeneratorExpression::Parse(&local_100,input);
          *(undefined1 *)
           ((long)&local_100.Backtrace.TopEntry.
                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr[4].field_0 + 8) = 1;
          local_f0._16_8_ = operator_new(0x28);
          peVar4 = local_100.Backtrace.TopEntry.
                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_100.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          *(pointer *)(local_f0._16_8_ + 8) = pcVar6;
          *(undefined8 *)(local_f0._16_8_ + 0x10) = 0;
          *(undefined8 *)(local_f0._16_8_ + 0x18) = 0;
          *(undefined ***)local_f0._16_8_ = &PTR__TargetPropertyEntryGenex_00629e80;
          *(element_type **)(local_f0._16_8_ + 0x20) = peVar4;
          local_108._M_t.
          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
               (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                  )0x0;
          std::
          vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
          ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
                    ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                      *)local_70,(TargetPropertyEntry **)(local_f0 + 0x10));
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&local_108);
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&local_100);
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)input);
          if (local_d0.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)local_b0) {
            operator_delete(local_d0.Backtrace.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)(local_b0._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != local_58);
    }
  }
  return;
}

Assistant:

static void AddInterfaceEntries(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::string const& prop,
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries)
{
  if (cmLinkImplementationLibraries const* impl =
        thisTarget->GetLinkImplementationLibraries(config)) {
    for (cmLinkImplItem const& lib : impl->Libraries) {
      if (lib.Target) {
        std::string uniqueName =
          thisTarget->GetGlobalGenerator()->IndexGeneratorTargetUniquely(
            lib.Target);
        std::string genex =
          "$<TARGET_PROPERTY:" + std::move(uniqueName) + "," + prop + ">";
        cmGeneratorExpression ge(lib.Backtrace);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(genex);
        cge->SetEvaluateForBuildsystem(true);
        entries.push_back(new TargetPropertyEntryGenex(std::move(cge), lib));
      }
    }
  }
}